

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

natwm_error config_find_number(map *config_map,char *key,intmax_t *result)

{
  natwm_error nVar1;
  config_value *pcVar2;
  
  pcVar2 = config_find(config_map,key);
  if (pcVar2 == (config_value *)0x0) {
    nVar1 = NOT_FOUND_ERROR;
  }
  else if (pcVar2->type == NUMBER) {
    *result = (intmax_t)pcVar2->data;
    nVar1 = NO_ERROR;
  }
  else {
    nVar1 = INVALID_INPUT_ERROR;
  }
  return nVar1;
}

Assistant:

enum natwm_error config_find_number(const struct map *config_map, const char *key, intmax_t *result)
{
        struct config_value *value = config_find(config_map, key);

        if (value == NULL) {
                return NOT_FOUND_ERROR;
        }

        if (value->type != NUMBER) {
                return INVALID_INPUT_ERROR;
        }

        *result = value->data.number;

        return NO_ERROR;
}